

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::compileConst(NodeTranslator *this,Reader decl,Builder builder)

{
  Reader source;
  Reader source_00;
  Builder target;
  Reader type;
  ImplicitParams implicitMethodParams;
  undefined1 auVar1 [40];
  Builder target_00;
  bool bVar2;
  Builder typeBuilder;
  undefined1 uStack_139;
  undefined4 uStack_134;
  StructBuilder local_130;
  PointerReader local_108;
  StructBuilder local_e8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  StructReader local_90;
  StructReader local_60;
  
  local_108.pointer = builder._builder.pointers + 3;
  local_108.segment = &(builder._builder.segment)->super_SegmentReader;
  local_108.capTable = &(builder._builder.capTable)->super_CapTableReader;
  capnp::_::PointerBuilder::initStruct(&local_130,(PointerBuilder *)&local_108,(StructSize)0x10003);
  if (decl._reader.pointerCount < 6) {
    local_108.nestingLimit = 0x7fffffff;
    local_108.capTable = (CapTableReader *)0x0;
    local_108.pointer = (WirePointer *)0x0;
    local_108.segment = (SegmentReader *)0x0;
  }
  else {
    local_108.pointer = decl._reader.pointers + 5;
    local_108.capTable = decl._reader.capTable;
    local_108.segment = decl._reader.segment;
    local_108.nestingLimit = decl._reader.nestingLimit;
  }
  capnp::_::PointerReader::getStruct(&local_60,&local_108,(word *)0x0);
  implicitMethodParams.params.reader._44_4_ = uStack_134;
  implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
  implicitMethodParams.params.reader._39_1_ = uStack_139;
  implicitMethodParams.params.reader.structDataSize = 0;
  implicitMethodParams.params.reader.structPointerCount = 0;
  implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
  source._reader.capTable = local_60.capTable;
  source._reader.segment = local_60.segment;
  source._reader.data = local_60.data;
  source._reader.pointers = local_60.pointers;
  source._reader.dataSize = local_60.dataSize;
  source._reader.pointerCount = local_60.pointerCount;
  source._reader._38_2_ = local_60._38_2_;
  source._reader.nestingLimit = local_60.nestingLimit;
  source._reader._44_4_ = local_60._44_4_;
  target._builder.capTable = local_130.capTable;
  target._builder.segment = local_130.segment;
  target._builder.data = local_130.data;
  target._builder.pointers = local_130.pointers;
  target._builder.dataSize = local_130.dataSize;
  target._builder.pointerCount = local_130.pointerCount;
  target._builder._38_2_ = local_130._38_2_;
  auVar1 = ZEXT1640(ZEXT816(0));
  implicitMethodParams.scopeId = auVar1._0_8_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)auVar1._8_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar1._16_8_;
  implicitMethodParams.params.reader.ptr = (byte *)auVar1._24_8_;
  implicitMethodParams.params.reader.elementCount = auVar1._32_4_;
  implicitMethodParams.params.reader.step = auVar1._36_4_;
  bVar2 = compileType(this,source,target,implicitMethodParams);
  if (bVar2) {
    if (decl._reader.pointerCount < 7) {
      decl._reader.nestingLimit = 0x7fffffff;
      decl._reader.capTable = (CapTableReader *)0x0;
      local_108.pointer = (WirePointer *)0x0;
      decl._reader.segment = (SegmentReader *)0x0;
    }
    else {
      local_108.pointer = decl._reader.pointers + 6;
    }
    local_108.segment = decl._reader.segment;
    local_108.capTable = decl._reader.capTable;
    local_108.nestingLimit = decl._reader.nestingLimit;
    capnp::_::PointerReader::getStruct(&local_90,&local_108,(word *)0x0);
    capnp::_::StructBuilder::asReader(&local_130);
    local_108.pointer = builder._builder.pointers + 4;
    local_108.segment = &(builder._builder.segment)->super_SegmentReader;
    local_108.capTable = &(builder._builder.capTable)->super_CapTableReader;
    capnp::_::PointerBuilder::initStruct(&local_e8,(PointerBuilder *)&local_108,(StructSize)0x10002)
    ;
    source_00._reader.capTable = local_90.capTable;
    source_00._reader.segment = local_90.segment;
    source_00._reader.data = local_90.data;
    source_00._reader.pointers = local_90.pointers;
    source_00._reader.dataSize = local_90.dataSize;
    source_00._reader.pointerCount = local_90.pointerCount;
    source_00._reader._38_2_ = local_90._38_2_;
    source_00._reader.nestingLimit = local_90.nestingLimit;
    source_00._reader._44_4_ = local_90._44_4_;
    type._reader.capTable = (CapTableReader *)uStack_b8;
    type._reader.segment = (SegmentReader *)local_c0;
    type._reader.data = (void *)local_b0;
    type._reader.pointers = (WirePointer *)uStack_a8;
    type._reader.dataSize = (undefined4)local_a0;
    type._reader.pointerCount = local_a0._4_2_;
    type._reader._38_2_ = local_a0._6_2_;
    type._reader._40_8_ = uStack_98;
    target_00._builder.capTable = local_e8.capTable;
    target_00._builder.segment = local_e8.segment;
    target_00._builder.data = local_e8.data;
    target_00._builder.pointers = local_e8.pointers;
    target_00._builder.dataSize = local_e8.dataSize;
    target_00._builder.pointerCount = local_e8.pointerCount;
    target_00._builder._38_2_ = local_e8._38_2_;
    compileBootstrapValue(this,source_00,type,target_00,(Schema)0x649c50);
  }
  return;
}

Assistant:

void NodeTranslator::compileConst(Declaration::Const::Reader decl,
                                  schema::Node::Const::Builder builder) {
  auto typeBuilder = builder.initType();
  if (compileType(decl.getType(), typeBuilder, noImplicitParams())) {
    compileBootstrapValue(decl.getValue(), typeBuilder.asReader(), builder.initValue());
  }
}